

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O2

uint32 chksum_accum(void *buf,int32 el_sz,int32 n_el,uint32 sum)

{
  ulong uVar1;
  ulong uVar2;
  
  if (el_sz == 1) {
    uVar1 = 0;
    uVar2 = (ulong)(uint)n_el;
    if (n_el < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      sum = (sum << 5 | sum >> 0x1b) + (uint)*(byte *)((long)buf + uVar1);
    }
  }
  else if (el_sz == 2) {
    uVar1 = 0;
    uVar2 = (ulong)(uint)n_el;
    if (n_el < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      sum = (sum << 10 | sum >> 0x16) + (uint)*(ushort *)((long)buf + uVar1 * 2);
    }
  }
  else {
    if (el_sz != 4) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
              ,0x123,"Unsupported elemsize for checksum: %d\n");
      exit(1);
    }
    uVar1 = 0;
    uVar2 = (ulong)(uint)n_el;
    if (n_el < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      sum = (sum << 0x14 | sum >> 0xc) + *(int *)((long)buf + uVar1 * 4);
    }
  }
  return sum;
}

Assistant:

static uint32
chksum_accum(const void *buf, int32 el_sz, int32 n_el, uint32 sum)
{
    int32 i;
    uint8 *i8;
    uint16 *i16;
    uint32 *i32;

    switch (el_sz) {
    case 1:
        i8 = (uint8 *) buf;
        for (i = 0; i < n_el; i++)
            sum = (sum << 5 | sum >> 27) + i8[i];
        break;
    case 2:
        i16 = (uint16 *) buf;
        for (i = 0; i < n_el; i++)
            sum = (sum << 10 | sum >> 22) + i16[i];
        break;
    case 4:
        i32 = (uint32 *) buf;
        for (i = 0; i < n_el; i++)
            sum = (sum << 20 | sum >> 12) + i32[i];
        break;
    default:
        E_FATAL("Unsupported elemsize for checksum: %d\n", el_sz);
        break;
    }

    return sum;
}